

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O2

int identifyAtom(char *name,char *resname,int Verbose)

{
  char cVar1;
  char *__s;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  char cVar5;
  long lVar6;
  uint uVar7;
  char *__format;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  char warnresn [5];
  char warnstr [5];
  
  cVar5 = *name;
  uVar7 = 2;
  switch(cVar5) {
  case ' ':
  case '\"':
  case '\'':
  case '*':
  case '+':
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '_':
  case '`':
    bVar8 = name[1];
    switch(bVar8) {
    case 0x41:
      if (name[3] == '1') goto switchD_0011ffab_caseD_4f;
      if (name[3] == '2') goto switchD_0011ffab_caseD_4e;
      break;
    case 0x42:
      return 0x15;
    case 0x43:
      return 6;
    case 0x44:
      return 2;
    default:
      goto switchD_0011fb0d_caseD_45;
    case 0x46:
      return 10;
    case 0x48:
      cVar5 = name[2];
      if (cVar5 == 'O') {
        iVar2 = fixAtomName(name,resname,2);
        bVar9 = iVar2 == 0;
        iVar2 = 0x32;
      }
      else if (cVar5 == 'F') {
        iVar2 = fixAtomName(name,resname,2);
        bVar9 = iVar2 == 0;
        iVar2 = 0x30;
      }
      else if (cVar5 == 'G') {
        iVar2 = fixAtomName(name,resname,2);
        bVar9 = iVar2 == 0;
        iVar2 = 0x31;
      }
      else {
        if (cVar5 != 'E') {
          return 2;
        }
        iVar2 = fixAtomName(name,resname,2);
        bVar9 = iVar2 == 0;
        iVar2 = 0x2f;
      }
      if (!bVar9) {
        return iVar2;
      }
      return 2;
    case 0x49:
      return 0x33;
    case 0x4b:
      return 0x36;
    case 0x4e:
      return 8;
    case 0x4f:
      return 9;
    case 0x50:
      return 0xc;
    case 0x53:
      if (cVar5 != ' ') {
        return 0xb;
      }
      if (name[2] != 'E') {
        return 0xb;
      }
      bVar9 = true;
      uVar7 = 0x57;
      goto switchD_0011ffab_caseD_44;
    case 0x55:
      return 100;
    case 0x56:
      return 0x65;
    case 0x57:
      return 0x66;
    case 0x59:
      return 0x68;
    }
    goto switchD_0011ffab_caseD_41;
  default:
    bVar8 = name[1];
    break;
  case 'A':
    bVar8 = name[1];
    bVar9 = true;
    switch(bVar8) {
    case 0x43:
      goto switchD_0011ffab_caseD_42;
    default:
      break;
    case 0x47:
      return 0xe;
    case 0x48:
      goto switchD_0011ffab_caseD_44;
    case 0x4c:
      return 0xf;
    case 0x4d:
      return 0x10;
    case 0x4e:
      goto switchD_0011ffab_caseD_4e;
    case 0x4f:
      goto switchD_0011ffab_caseD_4f;
    case 0x50:
      goto switchD_0011ffab_caseD_50;
    case 0x52:
      return 0x11;
    case 0x53:
      return 0x12;
    case 0x54:
      return 0x13;
    case 0x55:
      return 0x14;
    }
  case 'B':
    bVar8 = name[1];
    if (bVar8 == 0x41) {
      return 0x16;
    }
    if (bVar8 == 0x52) {
      return 0x1a;
    }
    if (bVar8 == 0x49) {
      return 0x18;
    }
    if (bVar8 == 0x4b) {
      return 0x19;
    }
    if (bVar8 == 0x45) {
      return 0x17;
    }
    break;
  case 'C':
    bVar9 = true;
    switch(name[1]) {
    case 'A':
      return 0x1b;
    default:
      goto switchD_0011ffab_caseD_42;
    case 'D':
      return 0x1c;
    case 'E':
      return 0x1d;
    case 'F':
      return 0x1e;
    case 'H':
      goto switchD_0011ffab_caseD_44;
    case 'L':
      return 0x1f;
    case 'M':
      return 0x20;
    case 'N':
      goto switchD_0011ffab_caseD_4e;
    case 'O':
      uVar7 = 0x21;
      break;
    case 'P':
      goto switchD_0011ffab_caseD_50;
    case 'R':
      return 0x22;
    case 'S':
      return 0x23;
    case 'U':
      return 0x24;
    }
    goto LAB_00120271;
  case 'D':
    cVar1 = name[1];
    bVar9 = true;
    switch(cVar1) {
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
      goto switchD_0011ffab_caseD_44;
    case 'N':
      goto switchD_0011ffab_caseD_4e;
    case 'O':
      goto switchD_0011ffab_caseD_4f;
    case 'P':
      goto switchD_0011ffab_caseD_50;
    default:
      if (cVar1 != 'C') {
        if (cVar1 == 'Y') {
          return 0x25;
        }
        goto switchD_0011ffab_caseD_44;
      }
    }
    goto switchD_0011ffab_caseD_42;
  case 'E':
    bVar8 = name[1];
    bVar9 = true;
    switch(bVar8) {
    case 0x43:
      goto switchD_0011ffab_caseD_42;
    default:
      break;
    case 0x48:
      goto switchD_0011ffab_caseD_44;
    case 0x4e:
      goto switchD_0011ffab_caseD_4e;
    case 0x4f:
      goto switchD_0011ffab_caseD_4f;
    case 0x50:
      goto switchD_0011ffab_caseD_50;
    case 0x52:
      return 0x26;
    case 0x53:
      return 0x27;
    case 0x55:
      return 0x28;
    }
  case 'F':
    bVar8 = name[1];
    bVar9 = true;
    switch(bVar8) {
    case 0x43:
      goto switchD_0011ffab_caseD_42;
    default:
      break;
    case 0x45:
      return 0x29;
    case 0x48:
      goto switchD_0011ffab_caseD_44;
    case 0x4d:
      return 0x2a;
    case 0x4e:
      goto switchD_0011ffab_caseD_4e;
    case 0x4f:
      goto switchD_0011ffab_caseD_4f;
    case 0x50:
      goto switchD_0011ffab_caseD_50;
    case 0x52:
      return 0x2b;
    }
  case 'G':
    bVar8 = name[1];
    bVar9 = true;
    switch(bVar8) {
    case 0x41:
      return 0x2c;
    default:
      break;
    case 0x43:
      goto switchD_0011ffab_caseD_42;
    case 0x44:
      return 0x2d;
    case 0x45:
      return 0x2e;
    case 0x48:
      goto switchD_0011ffab_caseD_44;
    case 0x4e:
      goto switchD_0011ffab_caseD_4e;
    case 0x4f:
      goto switchD_0011ffab_caseD_4f;
    case 0x50:
      goto switchD_0011ffab_caseD_50;
    }
  case 'H':
    cVar5 = name[1];
    if (cVar5 == 'O') {
      iVar2 = fixAtomName(name,resname,1);
      bVar9 = iVar2 == 0;
      iVar2 = 0x32;
    }
    else if (cVar5 == 'F') {
      iVar2 = fixAtomName(name,resname,1);
      bVar9 = iVar2 == 0;
      iVar2 = 0x30;
    }
    else if (cVar5 == 'G') {
      iVar2 = fixAtomName(name,resname,1);
      bVar9 = iVar2 == 0;
      iVar2 = 0x31;
    }
    else {
      if (cVar5 != 'E') {
        return 2;
      }
      iVar2 = fixAtomName(name,resname,1);
      bVar9 = iVar2 == 0;
      iVar2 = 0x2f;
    }
    if (!bVar9) {
      return iVar2;
    }
    return 2;
  case 'I':
    bVar8 = name[1];
    if (bVar8 == 0x4e) {
      return 0x34;
    }
    if (bVar8 == 0x52) {
      return 0x35;
    }
    break;
  case 'K':
    bVar8 = name[1];
    if (bVar8 == 0x52) {
      return 0x37;
    }
    break;
  case 'L':
    bVar8 = name[1];
    if (bVar8 == 0x41) {
      return 0x38;
    }
    if (bVar8 == 0x55) {
      return 0x3a;
    }
    if (bVar8 == 0x49) {
      return 0x39;
    }
    break;
  case 'M':
    bVar8 = name[1];
    if (bVar8 == 0x44) {
      return 0x3b;
    }
    if (bVar8 == 0x4f) {
      return 0x3e;
    }
    if (bVar8 == 0x4e) {
      return 0x3d;
    }
    if (bVar8 == 0x47) {
      return 0x3c;
    }
    break;
  case 'N':
    bVar9 = true;
    switch(name[1]) {
    case 'A':
      uVar7 = 0x3f;
      break;
    case 'B':
      uVar7 = 0x40;
      break;
    case 'C':
      goto switchD_0011ffab_caseD_42;
    case 'D':
      uVar7 = 0x41;
      break;
    case 'E':
      uVar7 = 0x42;
      break;
    default:
      goto switchD_0011ffab_caseD_4e;
    case 'H':
      goto switchD_0011ffab_caseD_44;
    case 'I':
      return 0x43;
    case 'O':
      goto switchD_0011ffab_caseD_4f;
    case 'P':
      goto switchD_0011ffab_caseD_50;
    case 'S':
      goto switchD_0011ffab_caseD_53;
    }
    goto LAB_00120271;
  case 'O':
    bVar9 = name[1] != 'S';
    uVar7 = 0x46;
    if (bVar9) {
      uVar7 = 9;
    }
    goto switchD_0011ffab_caseD_44;
  case 'P':
    cVar1 = name[1];
    switch(cVar1) {
    case 'M':
      return 0x4a;
    case 'N':
    case 'P':
    case 'Q':
    case 'S':
      goto switchD_0011ffab_caseD_50;
    case 'O':
      return 0x4b;
    case 'R':
      return 0x4c;
    case 'T':
      return 0x4d;
    case 'U':
      return 0x4e;
    default:
      if (cVar1 == 'A') {
        uVar7 = 0x47;
      }
      else if (cVar1 == 'D') {
        uVar7 = 0x49;
      }
      else {
        if (cVar1 != 'B') goto switchD_0011ffab_caseD_50;
        uVar7 = 0x48;
      }
    }
    goto LAB_00120271;
  case 'R':
    bVar8 = name[1];
    switch(bVar8) {
    case 0x41:
      return 0x4f;
    case 0x42:
      return 0x50;
    case 0x43:
    case 0x44:
    case 0x46:
    case 0x47:
      break;
    case 0x45:
      return 0x51;
    case 0x48:
      return 0x52;
    default:
      if (bVar8 == 0x4e) {
        return 0x53;
      }
      if (bVar8 == 0x55) {
        return 0x54;
      }
    }
    break;
  case 'S':
    switch(name[1]) {
    case 'B':
      uVar7 = 0x55;
      break;
    case 'C':
      return 0x56;
    default:
      goto switchD_0011ffab_caseD_53;
    case 'E':
      uVar7 = 0x57;
      break;
    case 'I':
      return 0x58;
    case 'M':
      return 0x59;
    case 'N':
      return 0x5a;
    case 'R':
      return 0x5b;
    }
    goto LAB_00120271;
  case 'T':
    bVar8 = name[1];
    uVar4 = bVar8 - 0x41;
    if (((byte)uVar4 < 0xd) && ((0x1997U >> (uVar4 & 0x1f) & 1) != 0)) {
      return *(int *)(&DAT_001354a0 + (ulong)(uVar4 & 0xff) * 4);
    }
    break;
  case 'X':
    bVar8 = name[1];
    if (bVar8 == 0x45) {
      return 0x67;
    }
    break;
  case 'Y':
    bVar8 = name[1];
    if (bVar8 == 0x42) {
      return 0x69;
    }
    break;
  case 'Z':
    bVar8 = name[1];
    if (bVar8 == 0x4e) {
      return 0x6a;
    }
    if (bVar8 == 0x52) {
      return 0x6b;
    }
  }
switchD_0011fb0d_caseD_45:
  bVar9 = true;
  switch(bVar8) {
  case 0x41:
switchD_0011ffab_caseD_41:
    cVar1 = name[2];
    if (cVar1 == 'U') {
      uVar7 = 0x14;
    }
    else if (cVar1 == 'L') {
      uVar7 = 0xf;
    }
    else if (cVar1 == 'S') {
      uVar7 = 0x12;
    }
    else {
      if (cVar1 != 'G') goto switchD_0011ffab_caseD_42;
      uVar7 = 0xe;
    }
    break;
  default:
switchD_0011ffab_caseD_42:
    bVar9 = true;
    uVar7 = 6;
  case 0x44:
  case 0x48:
    goto switchD_0011ffab_caseD_44;
  case 0x46:
    bVar10 = name[2] == 'E';
    uVar4 = 0x29;
    goto LAB_0012008b;
  case 0x47:
    bVar10 = name[2] == 'D';
    uVar4 = 0x2d;
    goto LAB_0012008b;
  case 0x49:
    uVar7 = 0x33;
    break;
  case 0x4b:
    uVar7 = 0x36;
    break;
  case 0x4c:
    bVar10 = name[2] == 'I';
    uVar4 = 0x39;
    goto LAB_0012008b;
  case 0x4d:
    cVar1 = name[2];
    if (cVar1 == 'O') {
      uVar7 = 0x3e;
    }
    else if (cVar1 == 'N') {
      uVar7 = 0x3d;
    }
    else {
      if (cVar1 != 'G') goto switchD_0011ffab_caseD_42;
      uVar7 = 0x3c;
    }
    break;
  case 0x4e:
switchD_0011ffab_caseD_4e:
    uVar7 = 8;
    break;
  case 0x4f:
switchD_0011ffab_caseD_4f:
    uVar7 = 9;
    break;
  case 0x50:
switchD_0011ffab_caseD_50:
    uVar7 = 0xc;
    break;
  case 0x53:
switchD_0011ffab_caseD_53:
    uVar7 = 0xb;
    break;
  case 0x55:
    uVar7 = 100;
    break;
  case 0x56:
    uVar7 = 0x65;
    break;
  case 0x57:
    uVar7 = 0x66;
    break;
  case 0x5a:
    bVar10 = name[2] == 'N';
    uVar4 = 0x6a;
LAB_0012008b:
    uVar7 = 6;
    if (bVar10) {
      uVar7 = uVar4;
    }
    goto switchD_0011ffab_caseD_44;
  }
LAB_00120271:
  bVar9 = true;
switchD_0011ffab_caseD_44:
  if (!(bool)(bVar9 ^ 1U | Verbose == 0)) {
    builtin_strncpy(warnstr,"____",5);
    lVar6 = 0;
    builtin_strncpy(warnresn,"____",5);
    for (; (cVar5 != '\0' && (warnstr[lVar6] != '\0')); lVar6 = lVar6 + 1) {
      if (cVar5 == ' ') {
        cVar5 = '_';
      }
      warnstr[lVar6] = cVar5;
      cVar5 = name[lVar6 + 1];
    }
    for (lVar6 = 0; (resname[lVar6] != '\0' && (warnresn[lVar6] != '\0')); lVar6 = lVar6 + 1) {
      cVar5 = resname[lVar6];
      if (name[lVar6] == ' ') {
        cVar5 = '_';
      }
      warnresn[lVar6] = cVar5;
    }
    __s = AtomTblIndex[uVar7]->name;
    sVar3 = strlen(__s);
    __format = "WARNING: atom %s from resn %s will be treated as %s\n";
    if (sVar3 == 1) {
      __format = "WARNING: atom %s from resn %s will be treated as  %s\n";
    }
    fprintf(_stderr,__format,warnstr,warnresn,__s);
  }
  return uVar7;
}

Assistant:

int identifyAtom(char* name, char resname[], int Verbose) {  /*dcr041007 allow warning choice*/
   int n = -1, emitWarning = 0;

   switch(name[0]) {
   case '*': case '\'': case '"': case '`': case '_':
   case '+': case '-':  case ' ':
   case '0': case '1': case '2': case '3': case '4':
   case '5': case '6': case '7': case '8': case '9':
      switch(name[1]) {
      case 'A':
	 switch(name[3]) {
	 case '1': n = atomO; emitWarning = 1; break;
	 case '2': n = atomN; emitWarning = 1; break;
	 } break;
      case 'B': n = atomB; break;
      case 'C': n = atomC; break;
      case 'D': n = atomH; break;
      case 'F': n = atomF; break;
      case 'H':
        switch(name[2]) {
        case 'E': n = fixAtomName(name,resname,2) ? atomHe : atomH; break;
        case 'F': n = fixAtomName(name,resname,2) ? atomHf : atomH; break;
        case 'G': n = fixAtomName(name,resname,2) ? atomHg : atomH; break;
        case 'O': n = fixAtomName(name,resname,2) ? atomHo : atomH; break;
/*        case 'S': n = fixAtomName(name,resname,2) ? atomHs : atomH; break; */
        default : n = atomH; break;
        } break;
      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
    /*case 'S': n = atomS; break;*/
      case 'S':
         if(name[0] == ' ' && name[2] == 'E')
         {/*_SE likely refmac,cns missplaced Selenium atom name dcr041007*/
                n = atomSe; emitWarning = 1; break;
         }
         else  {n = atomS; break;} /*050121 NO warning for other S*/
      case 'U': n = atomU; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'Y': n = atomY; break;
      } break;
   case 'A':
      switch(name[1]) {
      case 'C': n = atomC;  emitWarning = 1;break;/*nonstd!*/
      case 'G': n = atomAg; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomAl; break;
      case 'M': n = atomAm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomAr; break;
      case 'S': n = atomAs; break;
      case 'T': n = atomAt; break;
      case 'U': n = atomAu; break;
      } break;
   case 'B':
      switch(name[1]) {
      case 'A': n = atomBa; break;
      case 'E': n = atomBe; break;
      case 'I': n = atomBi; break;
      case 'K': n = atomBk; break;
      case 'R': n = atomBr; break;
      } break;
   case 'C':
      switch(name[1]) {
      case 'A': n = atomCa; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomCd; break;
      case 'E': n = atomCe; break;
      case 'F': n = atomCf; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomCl; break;
      case 'M': n = atomCm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomCo; emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomCr; break;
      case 'S': n = atomCs; break;
      case 'U': n = atomCu; break;
      default:  n = atomC;  emitWarning = 1;break;
      } break;
   case 'D':
      switch(name[1]) {
      case 'Y': n = atomDy; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      default:  n = atomH;  emitWarning = 1;break;
      } break;
   case 'E':
      switch(name[1]) {
      case 'R': n = atomEr; break;
      case 'S': n = atomEs; break;
      case 'U': n = atomEu; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'F':
      switch(name[1]) {
      case 'E': n = atomFe; break;
      case 'M': n = atomFm; break;
      case 'R': n = atomFr; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'G':
      switch(name[1]) {
      case 'A': n = atomGa; break;
      case 'D': n = atomGd; break;
      case 'E': n = atomGe; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'H':
      switch(name[1]) {
      case 'E': n = fixAtomName(name,resname,1) ? atomHe : atomH; break;
      case 'F': n = fixAtomName(name,resname,1) ? atomHf : atomH; break;
      case 'G': n = fixAtomName(name,resname,1) ? atomHg : atomH; break;
      case 'O': n = fixAtomName(name,resname,1) ? atomHo : atomH; break;
/*      case 'S': n = fixAtomName(name,resname,1) ? atomHs : atomH; break; */
      default : n = atomH; break;
      } break;

/*    case 'E': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hepsilon?? */
/*  else {n = atomHe; emitWarning = 1;} */
/*  break; */
/*      case 'F': n = atomHf; emitWarning = 1;break; */
/*      case 'G': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hgamma?? */
/*  else {n = atomHg; emitWarning = 1;} */
/*  break; */
/*      case 'O': n = atomHo; emitWarning = 1;break; */
/*      default:  n = atomH;  emitWarning = 1;break; */
/*      } break; */

   case 'I':
      switch(name[1]) {
      case 'N': n = atomIn; break;
      case 'R': n = atomIr; break;
      } break;
   case 'K':
      if (name[1] == 'R') n = atomKr; break;
   case 'L':
      switch(name[1]) {
      case 'A': n = atomLa; break;
      case 'I': n = atomLi; break;
      case 'U': n = atomLu; break;
      } break;
   case 'M':
      switch(name[1]) {
      case 'D': n = atomMd; break;
      case 'G': n = atomMg; break;
      case 'N': n = atomMn; break;
      case 'O': n = atomMo; break;
      } break;
   case 'N':
      switch(name[1]) {
      case 'A': n = atomNa; emitWarning = 1;break;
      case 'B': n = atomNb; emitWarning = 1;break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomNd; emitWarning = 1;break;
      case 'E': n = atomNe; emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'I': n = atomNi; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;/*nonstd!*/
      case 'P': n = atomP;  emitWarning = 1;break;/*nonstd!*/
      case 'S': n = atomS;  emitWarning = 1;break;
      default:  n = atomN;  emitWarning = 1;break;
      } break;
   case 'O':
      switch(name[1]) {
      case 'S': n = atomOs; break;
      default:  n = atomO;  emitWarning = 1;break;
      } break;
   case 'P':
      switch(name[1]) {
      case 'A': n = atomPa; emitWarning = 1;break;
      case 'B': n = atomPb; emitWarning = 1;break;
      case 'D': n = atomPd; emitWarning = 1;break;
      case 'M': n = atomPm; break;
      case 'O': n = atomPo; break;
      case 'R': n = atomPr; break;
      case 'T': n = atomPt; break;
      case 'U': n = atomPu; break;
      default:  n = atomP;  emitWarning = 1;break;
      } break;
   case 'R':
      switch(name[1]) {
      case 'A': n = atomRa; break;
      case 'B': n = atomRb; break;
      case 'E': n = atomRe; break;
      case 'H': n = atomRh; break;
      case 'N': n = atomRn; break;
      case 'U': n = atomRu; break;
      } break;
   case 'S':
      switch(name[1]) {
      case 'B': n = atomSb; emitWarning = 1;break;
      case 'C': n = atomSc; break;
      case 'E': n = atomSe; emitWarning = 1;break;
      case 'I': n = atomSi; break;
      case 'M': n = atomSm; break;
      case 'N': n = atomSn; break;
      case 'R': n = atomSr; break;
      default:  n = atomS;  emitWarning = 1;break;
      } break;
   case 'T':
      switch(name[1]) {
      case 'A': n = atomTa; break;
      case 'B': n = atomTb; break;
      case 'C': n = atomTc; break;
      case 'E': n = atomTe; break;
      case 'H': n = atomTh; break;
      case 'I': n = atomTi; break;
      case 'L': n = atomTl; break;
      case 'M': n = atomTm; break;
      } break;
   case 'X':
      if (name[1] == 'E') n = atomXe; break;
   case 'Y':
      if (name[1] == 'B') n = atomYb; break;
   case 'Z':
      switch(name[1]) {
      case 'N': n = atomZn; break;
      case 'R': n = atomZr; break;
      } break;
   default: break;
   }

   if (n < 0) { emitWarning = 1;
      n = atomC;

      switch(name[1]) {
      case 'H': case 'D': n = atomH; break;
      case 'C': n = atomC; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
      case 'S': n = atomS; break;

      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'U': n = atomU; break;

      case 'A':
	 switch(name[2]) {
	 case 'G': n = atomAg; break;
	 case 'L': n = atomAl; break;
	 case 'S': n = atomAs; break;
	 case 'U': n = atomAu; break;
	 } break;
      case 'F':
	 if (name[2] == 'E') n = atomFe; break;
      case 'G':
	 if (name[2] == 'D') n = atomGd; break;
      case 'L':
	 if (name[2] == 'I') n = atomLi; break;
      case 'M':
	 switch(name[2]) {
	 case 'G': n = atomMg; break;
	 case 'N': n = atomMn; break;
	 case 'O': n = atomMo; break;
	 } break;
      case 'Z':
	 if (name[2] == 'N') n = atomZn; break;
/* --------- default if we fall through... ---------------------*/
      default: n = atomC; break;
      }
   }
   if (emitWarning && Verbose) {/*Verbose controlled dcr041007*/
      char warnstr[5]={'_','_','_','_','\0'}; /*dcr041007*/
      char warnresn[5]={'_','_','_','_','\0'}; /*rmi070719*/
      char* atstr;
      int j=0;
      while(name[j]!='\0'&&warnstr[j]!='\0')
      {/*explicitly show blanks so can understand atom name problem*/
         if(name[j]==' ') {warnstr[j]='_';}
         else             {warnstr[j]=name[j];}
         j++;
      }
      j=0;
      while(resname[j]!='\0'&&warnresn[j]!='\0')
      {/*explicitly show blanks so can understand residue/atom name problem*/
         if(name[j]==' ') {warnresn[j]='_';}
         else             {warnresn[j]=resname[j];}
         j++;
      }
      atstr = getAtomName(n);
      if(strlen(atstr)==1)
           {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as  %s\n",warnstr,warnresn,atstr);}
      else {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as %s\n",warnstr,warnresn,atstr);}
         /*name, getAtomName(n));*/
   }

   return n;
}